

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

bool type_do_match_placeholder_proc(Am_Object *ph,Am_Value *new_value,Am_Object *param_3)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object new_object;
  Am_Object proto;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Object local_18;
  
  bVar1 = false;
  in_value = Am_Object::Get(ph,0xfa,0);
  Am_Object::Am_Object(&local_18,in_value);
  if (new_value->type == 0xa001) {
    Am_Object::Am_Object(&local_20,new_value);
    Am_Object::Am_Object(&AStack_28,&local_18);
    bVar1 = Am_Object::Is_Instance_Of(&local_20,&AStack_28);
    Am_Object::~Am_Object(&AStack_28);
    Am_Object::~Am_Object(&local_20);
  }
  Am_Object::~Am_Object(&local_18);
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool, type_do_match_placeholder,
                 (Am_Object & ph, Am_Value &new_value,
                  Am_Object & /* sel_widget */))
{
  Am_Object proto = ph.Get(Am_VALUES);

  if (new_value.type != Am_OBJECT)
    return false;
  Am_Object new_object = new_value;
  if (new_object.Is_Instance_Of(proto))
    return true;
  else
    return false;
}